

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

bool __thiscall llvm::detail::IEEEFloat::convertFromStringSpecials(IEEEFloat *this,StringRef str)

{
  size_t sVar1;
  bool bVar2;
  long *plVar3;
  
  sVar1 = str.Length;
  plVar3 = (long *)str.Data;
  bVar2 = false;
  switch(sVar1 - 3) {
  case 0:
    if (*(char *)((long)plVar3 + 2) != 'f' || (short)*plVar3 != 0x6e69) {
      bVar2 = false;
      switch(sVar1 - 3) {
      case 0:
        goto switchD_00173a2f_caseD_0;
      case 1:
        goto switchD_001739f7_caseD_1;
      default:
        goto switchD_001739f7_caseD_2;
      case 5:
        goto switchD_001739f7_caseD_5;
      case 6:
        goto switchD_001739f7_caseD_6;
      }
    }
    goto LAB_00173b30;
  case 1:
switchD_001739f7_caseD_1:
    if ((int)*plVar3 != 0x666e492b) {
      if (sVar1 != 3) {
        if (sVar1 == 9) goto switchD_001739f7_caseD_6;
        if (sVar1 != 4) {
          return false;
        }
        if ((int)*plVar3 != 0x666e692d) goto LAB_00173ac8;
        goto LAB_00173b34;
      }
      goto switchD_00173a2f_caseD_0;
    }
LAB_00173b30:
    bVar2 = false;
    goto LAB_00173b39;
  default:
    goto switchD_001739f7_caseD_2;
  case 5:
    break;
  case 6:
    goto switchD_001739f7_caseD_6;
  }
switchD_001739f7_caseD_5:
  if (*plVar3 == 0x5954494e49464e49) goto LAB_00173b30;
  if (sVar1 == 3) goto switchD_00173a2f_caseD_0;
  if (sVar1 != 9) {
    if (sVar1 != 4) {
      return false;
    }
    goto switchD_001739f7_caseD_1;
  }
switchD_001739f7_caseD_6:
  if ((char)plVar3[1] == 'Y' && *plVar3 == 0x54494e49464e492d) {
LAB_00173b34:
    bVar2 = true;
LAB_00173b39:
    makeInf(this,bVar2);
  }
  else {
    if (sVar1 == 3) {
switchD_00173a2f_caseD_0:
      if (*(char *)((long)plVar3 + 2) != 'n' || (short)*plVar3 != 0x616e) {
        if (sVar1 == 4) goto LAB_00173b16;
        if (sVar1 != 3) {
          return false;
        }
        if (*(char *)((long)plVar3 + 2) != 'N' || (short)*plVar3 != 0x614e) {
          return false;
        }
      }
      bVar2 = false;
    }
    else {
      if (sVar1 != 4) {
        return false;
      }
LAB_00173ac8:
      if ((int)*plVar3 == 0x666e492d) goto LAB_00173b34;
      if (sVar1 != 4) {
        if (sVar1 != 3) {
          return false;
        }
        goto switchD_00173a2f_caseD_0;
      }
LAB_00173b16:
      if (((int)*plVar3 != 0x6e616e2d) && ((sVar1 != 4 || ((int)*plVar3 != 0x4e614e2d)))) {
        return false;
      }
      bVar2 = true;
    }
    makeNaN(this,false,bVar2,(APInt *)0x0);
  }
  bVar2 = true;
switchD_001739f7_caseD_2:
  return bVar2;
}

Assistant:

bool IEEEFloat::convertFromStringSpecials(StringRef str) {
  if (str.equals("inf") || str.equals("INFINITY") || str.equals("+Inf")) {
    makeInf(false);
    return true;
  }

  if (str.equals("-inf") || str.equals("-INFINITY") || str.equals("-Inf")) {
    makeInf(true);
    return true;
  }

  if (str.equals("nan") || str.equals("NaN")) {
    makeNaN(false, false);
    return true;
  }

  if (str.equals("-nan") || str.equals("-NaN")) {
    makeNaN(false, true);
    return true;
  }

  return false;
}